

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

int slang::syntax::SyntaxFacts::getPrecedence(SyntaxKind kind)

{
  int local_c;
  SyntaxKind kind_local;
  
  switch(kind) {
  case AddAssignmentExpression:
  case AndAssignmentExpression:
  case ArithmeticLeftShiftAssignmentExpression:
  case ArithmeticRightShiftAssignmentExpression:
  case AssignmentExpression:
  case DivideAssignmentExpression:
  case FollowedByPropertyExpr:
  case ImplicationPropertyExpr:
  case LogicalLeftShiftAssignmentExpression:
  case LogicalRightShiftAssignmentExpression:
  case ModAssignmentExpression:
  case MultiplyAssignmentExpression:
  case NonblockingAssignmentExpression:
  case OrAssignmentExpression:
  case SubtractAssignmentExpression:
  case XorAssignmentExpression:
    local_c = 1;
    break;
  case AddExpression:
  case SubtractExpression:
    local_c = 0xb;
    break;
  default:
    local_c = 0;
    break;
  case AndPropertyExpr:
  case AndSequenceExpr:
  case BinaryOrExpression:
    local_c = 5;
    break;
  case ArithmeticShiftLeftExpression:
  case ArithmeticShiftRightExpression:
  case LogicalShiftLeftExpression:
  case LogicalShiftRightExpression:
    local_c = 10;
    break;
  case BinaryAndExpression:
  case WithinSequenceExpr:
    local_c = 7;
    break;
  case BinaryXnorExpression:
  case BinaryXorExpression:
  case IntersectSequenceExpr:
    local_c = 6;
    break;
  case CaseEqualityExpression:
  case CaseInequalityExpression:
  case EqualityExpression:
  case InequalityExpression:
  case ThroughoutSequenceExpr:
  case WildcardEqualityExpression:
  case WildcardInequalityExpression:
    local_c = 8;
    break;
  case DivideExpression:
  case ModExpression:
  case MultiplyExpression:
    local_c = 0xc;
    break;
  case ExpressionOrDist:
  case GreaterThanEqualExpression:
  case GreaterThanExpression:
  case InsideExpression:
  case LessThanEqualExpression:
  case LessThanExpression:
    local_c = 9;
    break;
  case IffPropertyExpr:
  case LogicalOrExpression:
    local_c = 3;
    break;
  case ImpliesPropertyExpr:
  case LogicalEquivalenceExpression:
  case LogicalImplicationExpression:
  case SUntilPropertyExpr:
  case SUntilWithPropertyExpr:
  case UntilPropertyExpr:
  case UntilWithPropertyExpr:
    local_c = 2;
    break;
  case LogicalAndExpression:
  case OrPropertyExpr:
  case OrSequenceExpr:
    local_c = 4;
    break;
  case PowerExpression:
    local_c = 0xd;
    break;
  case UnaryBitwiseAndExpression:
  case UnaryBitwiseNandExpression:
  case UnaryBitwiseNorExpression:
  case UnaryBitwiseNotExpression:
  case UnaryBitwiseOrExpression:
  case UnaryBitwiseXnorExpression:
  case UnaryBitwiseXorExpression:
  case UnaryLogicalNotExpression:
  case UnaryMinusExpression:
  case UnaryPlusExpression:
  case UnaryPredecrementExpression:
  case UnaryPreincrementExpression:
    local_c = 0xe;
  }
  return local_c;
}

Assistant:

int SyntaxFacts::getPrecedence(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AssignmentExpression:
        case SyntaxKind::AddAssignmentExpression:
        case SyntaxKind::SubtractAssignmentExpression:
        case SyntaxKind::MultiplyAssignmentExpression:
        case SyntaxKind::DivideAssignmentExpression:
        case SyntaxKind::ModAssignmentExpression:
        case SyntaxKind::AndAssignmentExpression:
        case SyntaxKind::OrAssignmentExpression:
        case SyntaxKind::XorAssignmentExpression:
        case SyntaxKind::LogicalLeftShiftAssignmentExpression:
        case SyntaxKind::LogicalRightShiftAssignmentExpression:
        case SyntaxKind::ArithmeticLeftShiftAssignmentExpression:
        case SyntaxKind::ArithmeticRightShiftAssignmentExpression:
        case SyntaxKind::NonblockingAssignmentExpression:
        case SyntaxKind::ImplicationPropertyExpr:
        case SyntaxKind::FollowedByPropertyExpr:
            return 1;
        case SyntaxKind::LogicalImplicationExpression:
        case SyntaxKind::LogicalEquivalenceExpression:
        case SyntaxKind::UntilPropertyExpr:
        case SyntaxKind::SUntilPropertyExpr:
        case SyntaxKind::UntilWithPropertyExpr:
        case SyntaxKind::SUntilWithPropertyExpr:
        case SyntaxKind::ImpliesPropertyExpr:
            return 2;
        case SyntaxKind::LogicalOrExpression:
        case SyntaxKind::IffPropertyExpr:
            return 3;
        case SyntaxKind::LogicalAndExpression:
        case SyntaxKind::OrPropertyExpr:
        case SyntaxKind::OrSequenceExpr:
            return 4;
        case SyntaxKind::BinaryOrExpression:
        case SyntaxKind::AndPropertyExpr:
        case SyntaxKind::AndSequenceExpr:
            return 5;
        case SyntaxKind::BinaryXorExpression:
        case SyntaxKind::BinaryXnorExpression:
        case SyntaxKind::IntersectSequenceExpr:
            return 6;
        case SyntaxKind::BinaryAndExpression:
        case SyntaxKind::WithinSequenceExpr:
            return 7;
        case SyntaxKind::EqualityExpression:
        case SyntaxKind::InequalityExpression:
        case SyntaxKind::CaseEqualityExpression:
        case SyntaxKind::CaseInequalityExpression:
        case SyntaxKind::WildcardEqualityExpression:
        case SyntaxKind::WildcardInequalityExpression:
        case SyntaxKind::ThroughoutSequenceExpr:
            return 8;
        case SyntaxKind::LessThanExpression:
        case SyntaxKind::LessThanEqualExpression:
        case SyntaxKind::GreaterThanExpression:
        case SyntaxKind::GreaterThanEqualExpression:
        case SyntaxKind::InsideExpression:
        case SyntaxKind::ExpressionOrDist:
            return 9;
        case SyntaxKind::LogicalShiftLeftExpression:
        case SyntaxKind::LogicalShiftRightExpression:
        case SyntaxKind::ArithmeticShiftLeftExpression:
        case SyntaxKind::ArithmeticShiftRightExpression:
            return 10;
        case SyntaxKind::AddExpression:
        case SyntaxKind::SubtractExpression:
            return 11;
        case SyntaxKind::MultiplyExpression:
        case SyntaxKind::DivideExpression:
        case SyntaxKind::ModExpression:
            return 12;
        case SyntaxKind::PowerExpression:
            return 13;
        case SyntaxKind::UnaryPlusExpression:
        case SyntaxKind::UnaryMinusExpression:
        case SyntaxKind::UnaryLogicalNotExpression:
        case SyntaxKind::UnaryBitwiseNotExpression:
        case SyntaxKind::UnaryBitwiseAndExpression:
        case SyntaxKind::UnaryBitwiseNandExpression:
        case SyntaxKind::UnaryBitwiseOrExpression:
        case SyntaxKind::UnaryBitwiseNorExpression:
        case SyntaxKind::UnaryBitwiseXorExpression:
        case SyntaxKind::UnaryBitwiseXnorExpression:
        case SyntaxKind::UnaryPreincrementExpression:
        case SyntaxKind::UnaryPredecrementExpression:
            return 14;
        default:
            return 0;
    }
}